

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *pcVar6;
  char **local_628;
  char **local_620;
  char **local_618;
  char **local_610;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  char **local_4a0;
  char **needCxxLevel;
  string local_478 [32];
  ostringstream local_458 [8];
  ostringstream e_1;
  cmStrCmp local_2e0;
  char **local_2c0;
  char **existingCudaLevel;
  string local_2b0;
  char *local_290;
  char *existingCudaStandard;
  string local_268 [32];
  ostringstream local_248 [8];
  ostringstream e;
  cmStrCmp local_d0;
  char **local_b0;
  char **existingCxxLevel;
  string local_a0;
  char *local_80;
  char *defaultCxxStandard;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *existingCxxStandard;
  bool needCxx20;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  string *psStack_30;
  bool needCxx98;
  string *error_local;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  existingCxxStandard._7_1_ = 0;
  existingCxxStandard._6_1_ = 0;
  existingCxxStandard._5_1_ = 0;
  existingCxxStandard._4_1_ = 0;
  existingCxxStandard._3_1_ = 0;
  psStack_30 = error;
  error_local = feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  CheckNeededCxxLanguage
            (this,feature,(bool *)((long)&existingCxxStandard + 7),
             (bool *)((long)&existingCxxStandard + 6),(bool *)((long)&existingCxxStandard + 5),
             (bool *)((long)&existingCxxStandard + 4),(bool *)((long)&existingCxxStandard + 3));
  psVar5 = feature_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"CXX_STANDARD",&local_61);
  pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_40 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CMAKE_CXX_STANDARD_DEFAULT",
               (allocator<char> *)((long)&existingCxxLevel + 7));
    pcVar1 = GetDefinition(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&existingCxxLevel + 7));
    local_80 = pcVar1;
    if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
      local_40 = pcVar1;
    }
  }
  local_b0 = (char **)0x0;
  if (local_40 != (char *)0x0) {
    ppcVar2 = std::cbegin<char_const*[5]>(&CXX_STANDARDS);
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_d0,local_40);
    local_b0 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_d0);
    cmStrCmp::~cmStrCmp(&local_d0);
    ppcVar2 = local_b0;
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_248);
      poVar4 = std::operator<<((ostream *)local_248,"The CXX_STANDARD property on target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
      poVar4 = std::operator<<(poVar4,local_40);
      std::operator<<(poVar4,"\".");
      if (psStack_30 == (string *)0x0) {
        pcVar6 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&existingCudaStandard,&this->Backtrace);
        std::__cxx11::string::~string((string *)&existingCudaStandard);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)psStack_30,local_268);
        std::__cxx11::string::~string(local_268);
      }
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_248);
      goto LAB_00468312;
    }
  }
  psVar5 = feature_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"CUDA_STANDARD",(allocator<char> *)((long)&existingCudaLevel + 7))
  ;
  pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&existingCudaLevel + 7));
  local_2c0 = (char **)0x0;
  local_290 = pcVar1;
  if (pcVar1 != (char *)0x0) {
    ppcVar2 = std::cbegin<char_const*[5]>(&CXX_STANDARDS);
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_2e0,local_290);
    local_2c0 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_2e0);
    cmStrCmp::~cmStrCmp(&local_2e0);
    ppcVar2 = local_2c0;
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_458);
      poVar4 = std::operator<<((ostream *)local_458,"The CUDA_STANDARD property on target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
      poVar4 = std::operator<<(poVar4,local_290);
      std::operator<<(poVar4,"\".");
      if (psStack_30 == (string *)0x0) {
        pcVar6 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(pcVar6,FATAL_ERROR,(string *)&needCxxLevel,&this->Backtrace);
        std::__cxx11::string::~string((string *)&needCxxLevel);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)psStack_30,local_478);
        std::__cxx11::string::~string(local_478);
      }
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_458);
      goto LAB_00468312;
    }
  }
  psVar5 = feature_local;
  if ((existingCxxStandard._3_1_ & 1) == 0) {
    if ((existingCxxStandard._4_1_ & 1) == 0) {
      if ((existingCxxStandard._5_1_ & 1) == 0) {
        if ((existingCxxStandard._6_1_ & 1) == 0) {
          local_628 = (char **)0x0;
          if ((existingCxxStandard._7_1_ & 1) != 0) {
            local_628 = CXX_STANDARDS;
          }
        }
        else {
          local_628 = CXX_STANDARDS + 1;
        }
        local_620 = local_628;
      }
      else {
        local_620 = CXX_STANDARDS + 2;
      }
      local_618 = local_620;
    }
    else {
      local_618 = CXX_STANDARDS + 3;
    }
    local_610 = local_618;
  }
  else {
    local_610 = CXX_STANDARDS + 4;
  }
  local_4a0 = local_610;
  if (local_610 != (char **)0x0) {
    if ((local_b0 == (char **)0x0) || (local_b0 < local_610)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"CXX_STANDARD",&local_4c1);
      cmTarget::SetProperty((cmTarget *)psVar5,&local_4c0,*local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
    }
    psVar5 = feature_local;
    if ((local_2c0 == (char **)0x0) || (local_2c0 < local_4a0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,"CUDA_STANDARD",&local_4e9);
      cmTarget::SetProperty((cmTarget *)psVar5,&local_4e8,*local_4a0);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
    }
  }
  this_local._7_1_ = 1;
LAB_00468312:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::AddRequiredTargetCxxFeature(cmTarget* target,
                                             const std::string& feature,
                                             std::string* error) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;
  bool needCxx20 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17, needCxx20);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard == nullptr) {
    const char* defaultCxxStandard =
      this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
    if (defaultCxxStandard && *defaultCxxStandard) {
      existingCxxStandard = defaultCxxStandard;
    }
  }
  const char* const* existingCxxLevel = nullptr;
  if (existingCxxStandard) {
    existingCxxLevel =
      std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(existingCxxStandard));
    if (existingCxxLevel == cm::cend(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }

  const char* existingCudaStandard = target->GetProperty("CUDA_STANDARD");
  const char* const* existingCudaLevel = nullptr;
  if (existingCudaStandard) {
    existingCudaLevel =
      std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(existingCudaStandard));
    if (existingCudaLevel == cm::cend(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CUDA_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCudaStandard
        << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }

  /* clang-format off */
  const char* const* needCxxLevel =
    needCxx20 ? &CXX_STANDARDS[4]
    : needCxx17 ? &CXX_STANDARDS[3]
    : needCxx14 ? &CXX_STANDARDS[2]
    : needCxx11 ? &CXX_STANDARDS[1]
    : needCxx98 ? &CXX_STANDARDS[0]
    : nullptr;
  /* clang-format on */

  if (needCxxLevel) {
    // Ensure the C++ language level is high enough to support
    // the needed C++ features.
    if (!existingCxxLevel || existingCxxLevel < needCxxLevel) {
      target->SetProperty("CXX_STANDARD", *needCxxLevel);
    }

    // Ensure the CUDA language level is high enough to support
    // the needed C++ features.
    if (!existingCudaLevel || existingCudaLevel < needCxxLevel) {
      target->SetProperty("CUDA_STANDARD", *needCxxLevel);
    }
  }

  return true;
}